

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_window_correctOverflow(ZSTD_window_t *window,U32 cycleLog,U32 maxDist,void *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_3c;
  U32 correction;
  U32 newCurrent;
  U32 currentCycle1;
  U32 currentCycle0;
  U32 current;
  U32 cycleMask;
  void *src_local;
  U32 maxDist_local;
  U32 cycleLog_local;
  ZSTD_window_t *window_local;
  
  uVar1 = (1 << ((byte)cycleLog & 0x1f)) - 1;
  uVar2 = (int)src - (int)window->base;
  local_3c = uVar2 & uVar1;
  if (local_3c == 0) {
    local_3c = 1 << ((byte)cycleLog & 0x1f);
  }
  local_3c = local_3c + maxDist;
  uVar3 = uVar2 - local_3c;
  if ((maxDist & uVar1) != 0) {
    __assert_fail("(maxDist & cycleMask) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2195,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (uVar2 <= local_3c) {
    __assert_fail("current > newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2196,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (uVar3 < 0x10000001) {
    __assert_fail("correction > 1<<28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2198,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  window->base = window->base + uVar3;
  window->dictBase = window->dictBase + uVar3;
  if (uVar3 < window->lowLimit) {
    window->lowLimit = window->lowLimit - uVar3;
  }
  else {
    window->lowLimit = 1;
  }
  if (uVar3 < window->dictLimit) {
    window->dictLimit = window->dictLimit - uVar3;
  }
  else {
    window->dictLimit = 1;
  }
  if (local_3c < maxDist) {
    __assert_fail("newCurrent >= maxDist",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x21a2,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (local_3c == maxDist) {
    __assert_fail("newCurrent - maxDist >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x21a3,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (local_3c < window->lowLimit) {
    __assert_fail("window->lowLimit <= newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x21a5,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (local_3c < window->dictLimit) {
    __assert_fail("window->dictLimit <= newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x21a6,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  return uVar3;
}

Assistant:

MEM_STATIC U32 ZSTD_window_correctOverflow(ZSTD_window_t* window, U32 cycleLog,
                                           U32 maxDist, void const* src)
{
    /* preemptive overflow correction:
     * 1. correction is large enough:
     *    lowLimit > (3<<29) ==> current > 3<<29 + 1<<windowLog
     *    1<<windowLog <= newCurrent < 1<<chainLog + 1<<windowLog
     *
     *    current - newCurrent
     *    > (3<<29 + 1<<windowLog) - (1<<windowLog + 1<<chainLog)
     *    > (3<<29) - (1<<chainLog)
     *    > (3<<29) - (1<<30)             (NOTE: chainLog <= 30)
     *    > 1<<29
     *
     * 2. (ip+ZSTD_CHUNKSIZE_MAX - cctx->base) doesn't overflow:
     *    After correction, current is less than (1<<chainLog + 1<<windowLog).
     *    In 64-bit mode we are safe, because we have 64-bit ptrdiff_t.
     *    In 32-bit mode we are safe, because (chainLog <= 29), so
     *    ip+ZSTD_CHUNKSIZE_MAX - cctx->base < 1<<32.
     * 3. (cctx->lowLimit + 1<<windowLog) < 1<<32:
     *    windowLog <= 31 ==> 3<<29 + 1<<windowLog < 7<<29 < 1<<32.
     */
    U32 const cycleMask = (1U << cycleLog) - 1;
    U32 const current = (U32)((BYTE const*)src - window->base);
    U32 const currentCycle0 = current & cycleMask;
    /* Exclude zero so that newCurrent - maxDist >= 1. */
    U32 const currentCycle1 = currentCycle0 == 0 ? (1U << cycleLog) : currentCycle0;
    U32 const newCurrent = currentCycle1 + maxDist;
    U32 const correction = current - newCurrent;
    assert((maxDist & cycleMask) == 0);
    assert(current > newCurrent);
    /* Loose bound, should be around 1<<29 (see above) */
    assert(correction > 1<<28);

    window->base += correction;
    window->dictBase += correction;
    if (window->lowLimit <= correction) window->lowLimit = 1;
    else window->lowLimit -= correction;
    if (window->dictLimit <= correction) window->dictLimit = 1;
    else window->dictLimit -= correction;

    /* Ensure we can still reference the full window. */
    assert(newCurrent >= maxDist);
    assert(newCurrent - maxDist >= 1);
    /* Ensure that lowLimit and dictLimit didn't underflow. */
    assert(window->lowLimit <= newCurrent);
    assert(window->dictLimit <= newCurrent);

    DEBUGLOG(4, "Correction of 0x%x bytes to lowLimit=0x%x", correction,
             window->lowLimit);
    return correction;
}